

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O3

void update_particle(PARTICLE *p,float dt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  if (p->active != 0) {
    fVar6 = dt * -0.125 + p->life;
    p->life = fVar6;
    if (fVar6 <= 0.0) {
      p->active = 0;
      return;
    }
    fVar7 = dt * -9.8 + p->vz;
    p->vz = fVar7;
    uVar1 = p->x;
    uVar3 = p->y;
    uVar2 = p->vx;
    uVar4 = p->vy;
    fVar6 = dt * (float)uVar2 + (float)uVar1;
    fVar5 = dt * (float)uVar4 + (float)uVar3;
    p->x = fVar6;
    p->y = fVar5;
    fVar8 = fVar7 * dt + p->z;
    p->z = fVar8;
    if ((fVar7 < 0.0) &&
       (((fVar6 * fVar6 + fVar5 * fVar5 < 3.8025002 && (fVar6 = 3.35, fVar8 < 3.35)) ||
        (fVar6 = 0.35, fVar8 < 0.35)))) {
      p->vz = fVar7 * -0.75;
      p->z = (fVar6 - fVar8) * 0.75 + fVar6;
    }
  }
  return;
}

Assistant:

static void update_particle(PARTICLE *p, float dt)
{
    // If the particle is not active, we need not do anything
    if (!p->active)
        return;

    // The particle is getting older...
    p->life -= dt * (1.f / LIFE_SPAN);

    // Did the particle die?
    if (p->life <= 0.f)
    {
        p->active = 0;
        return;
    }

    // Apply gravity
    p->vz = p->vz - GRAVITY * dt;

    // Update particle position
    p->x = p->x + p->vx * dt;
    p->y = p->y + p->vy * dt;
    p->z = p->z + p->vz * dt;

    // Simple collision detection + response
    if (p->vz < 0.f)
    {
        // Particles should bounce on the fountain (with friction)
        if ((p->x * p->x + p->y * p->y) < FOUNTAIN_R2 &&
            p->z < (FOUNTAIN_HEIGHT + PARTICLE_SIZE / 2))
        {
            p->vz = -FRICTION * p->vz;
            p->z  = FOUNTAIN_HEIGHT + PARTICLE_SIZE / 2 +
                    FRICTION * (FOUNTAIN_HEIGHT +
                    PARTICLE_SIZE / 2 - p->z);
        }

        // Particles should bounce on the floor (with friction)
        else if (p->z < PARTICLE_SIZE / 2)
        {
            p->vz = -FRICTION * p->vz;
            p->z  = PARTICLE_SIZE / 2 +
                    FRICTION * (PARTICLE_SIZE / 2 - p->z);
        }
    }
}